

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR lyxp_expr_parse(ly_ctx *ctx,char *expr_str,size_t expr_len,ly_bool reparse,lyxp_expr **expr_p
                      )

{
  int iVar1;
  LY_ERR LVar2;
  void *pvVar3;
  ushort **ppuVar4;
  size_t sVar5;
  ssize_t sVar6;
  bool bVar7;
  undefined8 in_stack_ffffffffffffff78;
  size_t local_70;
  ssize_t ncname_len;
  char local_5f;
  bool local_5e;
  bool local_5d;
  uint32_t tok_idx;
  ly_bool has_axis;
  ly_bool prev_ntype_check;
  ly_bool prev_func_check;
  size_t sStack_58;
  lyxp_token tok_type;
  size_t tok_len;
  size_t parsed;
  lyxp_expr *expr;
  lyxp_expr **pplStack_38;
  LY_ERR ret;
  lyxp_expr **expr_p_local;
  size_t sStack_28;
  ly_bool reparse_local;
  size_t expr_len_local;
  char *expr_str_local;
  ly_ctx *ctx_local;
  
  expr._4_4_ = 0;
  tok_len = 0;
  local_5d = false;
  local_5e = false;
  ncname_len._4_4_ = 0;
  pplStack_38 = expr_p;
  expr_p_local._7_1_ = reparse;
  sStack_28 = expr_len;
  expr_len_local = (size_t)expr_str;
  expr_str_local = (char *)ctx;
  if (expr_p == (lyxp_expr **)0x0) {
    __assert_fail("expr_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0xb52,
                  "LY_ERR lyxp_expr_parse(const struct ly_ctx *, const char *, size_t, ly_bool, struct lyxp_expr **)"
                 );
  }
  if (*expr_str == '\0') {
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
    return LY_EVALID;
  }
  if (expr_len == 0) {
    sStack_28 = strlen(expr_str);
  }
  if (0xffffffff < sStack_28) {
    ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
            "XPath expression cannot be longer than %u characters.",0xffffffff);
    return LY_EVALID;
  }
  parsed = (size_t)calloc(1,0x30);
  if ((void *)parsed == (void *)0x0) {
    ly_log((ly_ctx *)expr_str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyxp_expr_parse");
    expr._4_4_ = LY_EMEM;
  }
  else {
    expr._4_4_ = lydict_insert((ly_ctx *)expr_str_local,(char *)expr_len_local,sStack_28,
                               (char **)(parsed + 0x28));
    if (expr._4_4_ == LY_SUCCESS) {
      *(undefined4 *)(parsed + 0x20) = 0;
      *(undefined4 *)(parsed + 0x24) = 10;
      pvVar3 = malloc((ulong)*(uint *)(parsed + 0x24) << 2);
      *(void **)parsed = pvVar3;
      if (*(long *)parsed == 0) {
        ly_log((ly_ctx *)expr_str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyxp_expr_parse");
        expr._4_4_ = LY_EMEM;
      }
      else {
        pvVar3 = malloc((ulong)*(uint *)(parsed + 0x24) << 2);
        *(void **)(parsed + 8) = pvVar3;
        if (*(long *)(parsed + 8) == 0) {
          ly_log((ly_ctx *)expr_str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lyxp_expr_parse");
          expr._4_4_ = LY_EMEM;
        }
        else {
          pvVar3 = malloc((ulong)*(uint *)(parsed + 0x24) << 2);
          *(void **)(parsed + 0x10) = pvVar3;
          if (*(long *)(parsed + 0x10) == 0) {
            ly_log((ly_ctx *)expr_str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyxp_expr_parse");
            expr._4_4_ = LY_EMEM;
          }
          else {
            expr_len_local = *(size_t *)(parsed + 0x28);
            while( true ) {
              bVar7 = true;
              if (((*(char *)(expr_len_local + tok_len) != ' ') &&
                  (bVar7 = true, *(char *)(expr_len_local + tok_len) != '\t')) &&
                 (bVar7 = true, *(char *)(expr_len_local + tok_len) != '\n')) {
                bVar7 = *(char *)(expr_len_local + tok_len) == '\r';
              }
              LVar2 = expr._4_4_;
              if (!bVar7) break;
              tok_len = tok_len + 1;
            }
            do {
              expr._4_4_ = LVar2;
              if (*(char *)(expr_len_local + tok_len) == '(') {
                sStack_58 = 1;
                tok_idx = 1;
                if ((((local_5e == false) || (*(int *)(parsed + 0x20) == 0)) ||
                    (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4) != 10)) ||
                   (((*(int *)(*(long *)(parsed + 0x10) + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                      != 4 || ((iVar1 = strncmp((char *)(expr_len_local +
                                                        *(uint *)(*(long *)(parsed + 8) +
                                                                 (ulong)(*(int *)(parsed + 0x20) - 1
                                                                        ) * 4)),"node",4),
                               iVar1 != 0 &&
                               (iVar1 = strncmp((char *)(expr_len_local +
                                                        *(uint *)(*(long *)(parsed + 8) +
                                                                 (ulong)(*(int *)(parsed + 0x20) - 1
                                                                        ) * 4)),"text",4),
                               iVar1 != 0)))) &&
                    ((*(int *)(*(long *)(parsed + 0x10) + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                      != 7 || (iVar1 = strncmp((char *)(expr_len_local +
                                                       *(uint *)(*(long *)(parsed + 8) +
                                                                (ulong)(*(int *)(parsed + 0x20) - 1)
                                                                * 4)),"comment",7), iVar1 != 0))))))
                {
                  if (((local_5d != false) && (*(int *)(parsed + 0x20) != 0)) &&
                     (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4) == 10)) {
                    *(undefined4 *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4) =
                         0xd;
                    local_5e = false;
                    local_5d = false;
                  }
                }
                else {
                  *(undefined4 *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4) = 0xb;
                  local_5e = false;
                  local_5d = false;
                }
              }
              else if (*(char *)(expr_len_local + tok_len) == ')') {
                sStack_58 = 1;
                tok_idx = 2;
              }
              else if (*(char *)(expr_len_local + tok_len) == '[') {
                sStack_58 = 1;
                tok_idx = 3;
              }
              else if (*(char *)(expr_len_local + tok_len) == ']') {
                sStack_58 = 1;
                tok_idx = 4;
              }
              else {
                iVar1 = strncmp((char *)(expr_len_local + tok_len),"..",2);
                if (iVar1 == 0) {
                  sStack_58 = 2;
                  tok_idx = 6;
                }
                else if ((*(char *)(expr_len_local + tok_len) == '.') &&
                        (ppuVar4 = __ctype_b_loc(),
                        ((*ppuVar4)[(int)*(char *)(expr_len_local + 1 + tok_len)] & 0x800) == 0)) {
                  sStack_58 = 1;
                  tok_idx = 5;
                }
                else if (*(char *)(expr_len_local + tok_len) == '@') {
                  sStack_58 = 1;
                  tok_idx = 7;
                }
                else if (*(char *)(expr_len_local + tok_len) == ',') {
                  sStack_58 = 1;
                  tok_idx = 8;
                }
                else if (*(char *)(expr_len_local + tok_len) == '\'') {
                  sStack_58 = 1;
                  while( true ) {
                    bVar7 = false;
                    if (*(char *)(expr_len_local + tok_len + sStack_58) != '\0') {
                      bVar7 = *(char *)(expr_len_local + tok_len + sStack_58) != '\'';
                    }
                    if (!bVar7) break;
                    sStack_58 = sStack_58 + 1;
                  }
                  if (*(char *)(expr_len_local + tok_len + sStack_58) == '\0') {
                    ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                            "Unterminated string delimited with %c (%.15s).",
                            (ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                            expr_len_local + tok_len);
                    expr._4_4_ = LY_EVALID;
                    goto LAB_00211db6;
                  }
                  tok_idx = 0x17;
                  sStack_58 = sStack_58 + 1;
                }
                else if (*(char *)(expr_len_local + tok_len) == '\"') {
                  sStack_58 = 1;
                  while( true ) {
                    bVar7 = false;
                    if (*(char *)(expr_len_local + tok_len + sStack_58) != '\0') {
                      bVar7 = *(char *)(expr_len_local + tok_len + sStack_58) != '\"';
                    }
                    if (!bVar7) break;
                    sStack_58 = sStack_58 + 1;
                  }
                  if (*(char *)(expr_len_local + tok_len + sStack_58) == '\0') {
                    ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                            "Unterminated string delimited with %c (%.15s).",
                            (ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                            expr_len_local + tok_len);
                    expr._4_4_ = LY_EVALID;
                    goto LAB_00211db6;
                  }
                  tok_idx = 0x17;
                  sStack_58 = sStack_58 + 1;
                }
                else if ((*(char *)(expr_len_local + tok_len) == '.') ||
                        (ppuVar4 = __ctype_b_loc(),
                        ((*ppuVar4)[(int)*(char *)(expr_len_local + tok_len)] & 0x800) != 0)) {
                  sStack_58 = 0;
                  while (ppuVar4 = __ctype_b_loc(),
                        ((*ppuVar4)[(int)*(char *)(expr_len_local + tok_len + sStack_58)] & 0x800)
                        != 0) {
                    sStack_58 = sStack_58 + 1;
                  }
                  if (*(char *)(expr_len_local + tok_len + sStack_58) == '.') {
                    do {
                      sStack_58 = sStack_58 + 1;
                      ppuVar4 = __ctype_b_loc();
                    } while (((*ppuVar4)[(int)*(char *)(expr_len_local + tok_len + sStack_58)] &
                             0x800) != 0);
                  }
                  tok_idx = 0x18;
                }
                else if (*(char *)(expr_len_local + tok_len) == '$') {
                  tok_len = tok_len + 1;
                  sVar5 = parse_ncname((char *)(expr_len_local + tok_len));
                  if ((long)sVar5 < 1) {
                    ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                            "Invalid character \'%c\'[%u] of expression \'%s\'.",
                            (ulong)(uint)(int)*(char *)(expr_len_local + (tok_len - sVar5)),
                            (ulong)(((int)tok_len - (int)sVar5) + 1),expr_len_local);
                    expr._4_4_ = LY_EVALID;
                    goto LAB_00211db6;
                  }
                  sStack_58 = sVar5;
                  if (*(char *)(expr_len_local + tok_len + sVar5) == ':') {
                    ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                            "Variable with prefix is not supported.");
                    expr._4_4_ = LY_EVALID;
                    goto LAB_00211db6;
                  }
                  tok_idx = 0xc;
                }
                else if (*(char *)(expr_len_local + tok_len) == '/') {
                  iVar1 = strncmp((char *)(expr_len_local + tok_len),"//",2);
                  if (iVar1 == 0) {
                    sStack_58 = 2;
                    tok_idx = 0x15;
                  }
                  else {
                    sStack_58 = 1;
                    tok_idx = 0x14;
                  }
                }
                else {
                  iVar1 = strncmp((char *)(expr_len_local + tok_len),"!=",2);
                  if (iVar1 == 0) {
                    sStack_58 = 2;
                    tok_idx = 0x10;
                  }
                  else {
                    iVar1 = strncmp((char *)(expr_len_local + tok_len),"<=",2);
                    if ((iVar1 == 0) ||
                       (iVar1 = strncmp((char *)(expr_len_local + tok_len),">=",2), iVar1 == 0)) {
                      sStack_58 = 2;
                      tok_idx = 0x11;
                    }
                    else if (*(char *)(expr_len_local + tok_len) == '|') {
                      sStack_58 = 1;
                      tok_idx = 0x13;
                    }
                    else if ((*(char *)(expr_len_local + tok_len) == '+') ||
                            (*(char *)(expr_len_local + tok_len) == '-')) {
                      sStack_58 = 1;
                      tok_idx = 0x12;
                    }
                    else if (*(char *)(expr_len_local + tok_len) == '=') {
                      sStack_58 = 1;
                      tok_idx = 0xf;
                    }
                    else if ((*(char *)(expr_len_local + tok_len) == '<') ||
                            (*(char *)(expr_len_local + tok_len) == '>')) {
                      sStack_58 = 1;
                      tok_idx = 0x11;
                    }
                    else if (((((((*(int *)(parsed + 0x20) == 0) ||
                                 (*(int *)(*(long *)parsed +
                                          (ulong)(*(int *)(parsed + 0x20) - 1) * 4) == 7)) ||
                                (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4
                                         ) == 1)) ||
                               ((*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4
                                         ) == 3 ||
                                (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4
                                         ) == 8)))) ||
                              (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                               == 0xe)) ||
                             (((*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                                == 0xf ||
                               (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                                == 0x10)) ||
                              ((*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4)
                                == 0x11 ||
                               (((*(int *)(*(long *)parsed +
                                          (ulong)(*(int *)(parsed + 0x20) - 1) * 4) == 0x12 ||
                                 (*(int *)(*(long *)parsed +
                                          (ulong)(*(int *)(parsed + 0x20) - 1) * 4) == 0x13)) ||
                                (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4
                                         ) == 0x14)))))))) ||
                            (*(int *)(*(long *)parsed + (ulong)(*(int *)(parsed + 0x20) - 1) * 4) ==
                             0x15)) {
                      if (*(char *)(expr_len_local + tok_len) == '*') {
                        local_70 = 1;
                      }
                      else {
                        local_70 = parse_ncname((char *)(expr_len_local + tok_len));
                        if ((long)local_70 < 1) {
                          ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                  "Invalid character \'%c\'[%u] of expression \'%s\'.",
                                  (ulong)(uint)(int)*(char *)(expr_len_local + (tok_len - local_70))
                                  ,(ulong)(((int)tok_len - (int)local_70) + 1),expr_len_local);
                          expr._4_4_ = LY_EVALID;
                          goto LAB_00211db6;
                        }
                      }
                      sStack_58 = local_70;
                      local_5f = '\0';
                      iVar1 = strncmp((char *)(expr_len_local + tok_len + local_70),"::",2);
                      if (iVar1 == 0) {
                        LVar2 = expr_parse_axis((char *)(expr_len_local + tok_len),local_70);
                        if (LVar2 != LY_SUCCESS) {
                          ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                  "Invalid character \'%c\'[%u] of expression \'%s\'.",
                                  (ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                                  (ulong)((uint32_t)tok_len + 1),expr_len_local);
                          expr._4_4_ = LY_EVALID;
                          goto LAB_00211db6;
                        }
                        tok_idx = 0x16;
                        expr._4_4_ = exp_add_token((ly_ctx *)expr_str_local,(lyxp_expr *)parsed,
                                                   LYXP_TOKEN_AXISNAME,(uint32_t)tok_len,
                                                   (uint32_t)sStack_58);
                        if (expr._4_4_ != LY_SUCCESS) goto LAB_00211db6;
                        tok_len = sStack_58 + tok_len;
                        sStack_58 = 2;
                        tok_idx = 9;
                        expr._4_4_ = exp_add_token((ly_ctx *)expr_str_local,(lyxp_expr *)parsed,
                                                   LYXP_TOKEN_DCOLON,(uint32_t)tok_len,2);
                        if (expr._4_4_ != LY_SUCCESS) goto LAB_00211db6;
                        tok_len = sStack_58 + tok_len;
                        if (*(char *)(expr_len_local + tok_len) == '*') {
                          local_70 = 1;
                        }
                        else {
                          local_70 = parse_ncname((char *)(expr_len_local + tok_len));
                          if ((long)local_70 < 1) {
                            ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                    "Invalid character \'%c\'[%u] of expression \'%s\'.",
                                    (ulong)(uint)(int)*(char *)(expr_len_local +
                                                               (tok_len - local_70)),
                                    (ulong)(((int)tok_len - (int)local_70) + 1),expr_len_local);
                            expr._4_4_ = LY_EVALID;
                            goto LAB_00211db6;
                          }
                        }
                        sStack_58 = local_70;
                        local_5f = '\x01';
                      }
                      if (*(char *)(expr_len_local + tok_len + sStack_58) == ':') {
                        sVar5 = sStack_58 + 1;
                        if (*(char *)(expr_len_local + tok_len + sVar5) == '*') {
                          sStack_58 = sStack_58 + 2;
                        }
                        else {
                          sStack_58 = sVar5;
                          sVar6 = parse_ncname((char *)(expr_len_local + tok_len + sVar5));
                          if (sVar6 < 1) {
                            ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                    "Invalid character \'%c\'[%u] of expression \'%s\'.",
                                    (ulong)(uint)(int)*(char *)(expr_len_local + (tok_len - sVar6)),
                                    (ulong)(((int)tok_len - (int)sVar6) + 1),expr_len_local);
                            expr._4_4_ = LY_EVALID;
                            goto LAB_00211db6;
                          }
                          sStack_58 = sVar6 + sStack_58;
                        }
                        local_5e = false;
                        local_5d = false;
                      }
                      else {
                        local_5e = *(char *)(expr_len_local + tok_len) != '*';
                        local_5d = local_5e && local_5f == '\0';
                      }
                      tok_idx = 10;
                    }
                    else if (*(char *)(expr_len_local + tok_len) == '*') {
                      sStack_58 = 1;
                      tok_idx = 0x12;
                    }
                    else {
                      iVar1 = strncmp((char *)(expr_len_local + tok_len),"or",2);
                      if (iVar1 == 0) {
                        sStack_58 = 2;
                        tok_idx = 0xe;
                      }
                      else {
                        iVar1 = strncmp((char *)(expr_len_local + tok_len),"and",3);
                        if (iVar1 == 0) {
                          tok_idx = 0xe;
                        }
                        else {
                          iVar1 = strncmp((char *)(expr_len_local + tok_len),"mod",3);
                          if ((iVar1 != 0) &&
                             (iVar1 = strncmp((char *)(expr_len_local + tok_len),"div",3),
                             iVar1 != 0)) {
                            if ((local_5e == false) && (local_5d == false)) {
                              ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                      "Invalid character \'%c\'[%u] of expression \'%s\'.",
                                      (ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                                      (ulong)((int)tok_len + 1),expr_len_local);
                              expr._4_4_ = LY_EVALID;
                            }
                            else {
                              ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                                      "Invalid character 0x%x (\'%c\'), perhaps \"%.*s\" is supposed to be a function call."
                                      ,(ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                                      (ulong)(uint)(int)*(char *)(expr_len_local + tok_len),
                                      CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                               *(undefined4 *)
                                                (*(long *)(parsed + 0x10) +
                                                (ulong)(*(int *)(parsed + 0x20) - 1) * 4)),
                                      *(long *)(parsed + 0x28) +
                                      (ulong)*(uint *)(*(long *)(parsed + 8) +
                                                      (ulong)(*(int *)(parsed + 0x20) - 1) * 4));
                              expr._4_4_ = LY_EVALID;
                            }
                            goto LAB_00211db6;
                          }
                          tok_idx = 0x12;
                        }
                        sStack_58 = 3;
                      }
                    }
                  }
                }
              }
              expr._4_4_ = exp_add_token((ly_ctx *)expr_str_local,(lyxp_expr *)parsed,tok_idx,
                                         (uint32_t)tok_len,(uint32_t)sStack_58);
              if (expr._4_4_ != LY_SUCCESS) goto LAB_00211db6;
              tok_len = sStack_58 + tok_len;
              while( true ) {
                bVar7 = true;
                if (((*(char *)(expr_len_local + tok_len) != ' ') &&
                    (bVar7 = true, *(char *)(expr_len_local + tok_len) != '\t')) &&
                   (bVar7 = true, *(char *)(expr_len_local + tok_len) != '\n')) {
                  bVar7 = *(char *)(expr_len_local + tok_len) == '\r';
                }
                if (!bVar7) break;
                tok_len = tok_len + 1;
              }
              LVar2 = LY_SUCCESS;
            } while (*(char *)(expr_len_local + tok_len) != '\0');
            if (expr_p_local._7_1_ == '\0') {
LAB_00211d99:
              print_expr_struct_debug((lyxp_expr *)parsed);
              *pplStack_38 = (lyxp_expr *)parsed;
              return LY_SUCCESS;
            }
            pvVar3 = calloc((ulong)*(uint *)(parsed + 0x24),8);
            *(void **)(parsed + 0x18) = pvVar3;
            if (*(long *)(parsed + 0x18) == 0) {
              ly_log((ly_ctx *)expr_str_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lyxp_expr_parse");
              expr._4_4_ = LY_EMEM;
            }
            else {
              LVar2 = reparse_or_expr((ly_ctx *)expr_str_local,(lyxp_expr *)parsed,
                                      (uint32_t *)((long)&ncname_len + 4),0);
              if (LVar2 == LY_SUCCESS) {
                if (*(uint *)(parsed + 0x20) <= ncname_len._4_4_) goto LAB_00211d99;
                ly_vlog((ly_ctx *)expr_str_local,(char *)0x0,LYVE_XPATH,
                        "Unparsed characters \"%s\" left at the end of an XPath expression.",
                        *(long *)(parsed + 0x28) +
                        (ulong)*(uint *)(*(long *)(parsed + 8) + (ulong)ncname_len._4_4_ * 4));
                expr._4_4_ = LY_EVALID;
              }
              else {
                expr._4_4_ = LY_EVALID;
              }
            }
          }
        }
      }
    }
  }
LAB_00211db6:
  lyxp_expr_free((ly_ctx *)expr_str_local,(lyxp_expr *)parsed);
  return expr._4_4_;
}

Assistant:

LY_ERR
lyxp_expr_parse(const struct ly_ctx *ctx, const char *expr_str, size_t expr_len, ly_bool reparse, struct lyxp_expr **expr_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *expr;
    size_t parsed = 0, tok_len;
    enum lyxp_token tok_type;
    ly_bool prev_func_check = 0, prev_ntype_check = 0, has_axis;
    uint32_t tok_idx = 0;
    ssize_t ncname_len;

    assert(expr_p);

    if (!expr_str[0]) {
        LOGVAL(ctx, LY_VCODE_XP_EOF);
        return LY_EVALID;
    }

    if (!expr_len) {
        expr_len = strlen(expr_str);
    }
    if (expr_len > UINT32_MAX) {
        LOGVAL(ctx, LYVE_XPATH, "XPath expression cannot be longer than %" PRIu32 " characters.", UINT32_MAX);
        return LY_EVALID;
    }

    /* init lyxp_expr structure */
    expr = calloc(1, sizeof *expr);
    LY_CHECK_ERR_GOTO(!expr, LOGMEM(ctx); ret = LY_EMEM, error);
    LY_CHECK_GOTO(ret = lydict_insert(ctx, expr_str, expr_len, &expr->expr), error);
    expr->used = 0;
    expr->size = LYXP_EXPR_SIZE_START;
    expr->tokens = malloc(expr->size * sizeof *expr->tokens);
    LY_CHECK_ERR_GOTO(!expr->tokens, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_pos = malloc(expr->size * sizeof *expr->tok_pos);
    LY_CHECK_ERR_GOTO(!expr->tok_pos, LOGMEM(ctx); ret = LY_EMEM, error);

    expr->tok_len = malloc(expr->size * sizeof *expr->tok_len);
    LY_CHECK_ERR_GOTO(!expr->tok_len, LOGMEM(ctx); ret = LY_EMEM, error);

    /* make expr 0-terminated */
    expr_str = expr->expr;

    while (is_xmlws(expr_str[parsed])) {
        ++parsed;
    }

    do {
        if (expr_str[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_ntype_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST) &&
                    (((expr->tok_len[expr->used - 1] == 4) &&
                    (!strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "node", 4) ||
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "text", 4))) ||
                    ((expr->tok_len[expr->used - 1] == 7) &&
                    !strncmp(&expr_str[expr->tok_pos[expr->used - 1]], "comment", 7)))) {
                /* it is NodeType after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_NODETYPE;

                prev_ntype_check = 0;
                prev_func_check = 0;
            } else if (prev_func_check && expr->used && (expr->tokens[expr->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is FunctionName after all */
                expr->tokens[expr->used - 1] = LYXP_TOKEN_FUNCNAME;

                prev_ntype_check = 0;
                prev_func_check = 0;
            }

        } else if (expr_str[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr_str[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr_str[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr_str[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr_str[parsed] == '.') && (!isdigit(expr_str[parsed + 1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr_str[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr_str[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr_str[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\''); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr_str[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; (expr_str[parsed + tok_len] != '\0') && (expr_str[parsed + tok_len] != '\"'); ++tok_len) {}
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == '\0',
                    LOGVAL(ctx, LY_VCODE_XP_EOE, expr_str[parsed], &expr_str[parsed]); ret = LY_EVALID,
                    error);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr_str[parsed] == '.') || (isdigit(expr_str[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            if (expr_str[parsed + tok_len] == '.') {
                ++tok_len;
                for ( ; isdigit(expr_str[parsed + tok_len]); ++tok_len) {}
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr_str[parsed] == '$') {

            /* VariableReference */
            parsed++;
            ncname_len = parse_ncname(&expr_str[parsed]);
            LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                    (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            tok_len = ncname_len;
            LY_CHECK_ERR_GOTO(expr_str[parsed + tok_len] == ':',
                    LOGVAL(ctx, LYVE_XPATH, "Variable with prefix is not supported."); ret = LY_EVALID,
                    error);
            tok_type = LYXP_TOKEN_VARREF;

        } else if (expr_str[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr_str[parsed], "//", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_RPATH;
            } else {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_PATH;
            }

        } else if (!strncmp(&expr_str[parsed], "!=", 2)) {

            /* Operator '!=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_NEQUAL;

        } else if (!strncmp(&expr_str[parsed], "<=", 2) || !strncmp(&expr_str[parsed], ">=", 2)) {

            /* Operator '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr_str[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_UNI;

        } else if ((expr_str[parsed] == '+') || (expr_str[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_MATH;

        } else if (expr_str[parsed] == '=') {

            /* Operator '=' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_EQUAL;

        } else if ((expr_str[parsed] == '<') || (expr_str[parsed] == '>')) {

            /* Operator '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPER_COMP;

        } else if (expr->used && (expr->tokens[expr->used - 1] != LYXP_TOKEN_AT) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_PAR1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_BRACK1) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_COMMA) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_LOG) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_EQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_NEQUAL) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_COMP) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_MATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_UNI) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_PATH) &&
                (expr->tokens[expr->used - 1] != LYXP_TOKEN_OPER_RPATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr_str[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (!strncmp(&expr_str[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_LOG;

            } else if (!strncmp(&expr_str[parsed], "mod", 3) || !strncmp(&expr_str[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPER_MATH;

            } else if (prev_ntype_check || prev_func_check) {
                LOGVAL(ctx, LYVE_XPATH,
                        "Invalid character 0x%x ('%c'), perhaps \"%.*s\" is supposed to be a function call.",
                        expr_str[parsed], expr_str[parsed], (int)expr->tok_len[expr->used - 1],
                        &expr->expr[expr->tok_pos[expr->used - 1]]);
                ret = LY_EVALID;
                goto error;
            } else {
                LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str);
                ret = LY_EVALID;
                goto error;
            }
        } else {

            /* (AxisName '::')? ((NCName ':')? '*' | QName) or NodeType/FunctionName */
            if (expr_str[parsed] == '*') {
                ncname_len = 1;
            } else {
                ncname_len = parse_ncname(&expr_str[parsed]);
                LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                        (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
            }
            tok_len = ncname_len;

            has_axis = 0;
            if (!strncmp(&expr_str[parsed + tok_len], "::", 2)) {
                /* axis */
                LY_CHECK_ERR_GOTO(expr_parse_axis(&expr_str[parsed], ncname_len),
                        LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed], (uint32_t)(parsed + 1), expr_str); ret = LY_EVALID,
                        error);
                tok_type = LYXP_TOKEN_AXISNAME;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                /* '::' */
                tok_len = 2;
                tok_type = LYXP_TOKEN_DCOLON;

                LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
                parsed += tok_len;

                if (expr_str[parsed] == '*') {
                    ncname_len = 1;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                }
                tok_len = ncname_len;

                has_axis = 1;
            }

            if (expr_str[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr_str[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr_str[parsed + tok_len]);
                    LY_CHECK_ERR_GOTO(ncname_len < 1, LOGVAL(ctx, LY_VCODE_XP_INEXPR, expr_str[parsed - ncname_len],
                            (uint32_t)(parsed - ncname_len + 1), expr_str); ret = LY_EVALID, error);
                    tok_len += ncname_len;
                }
                /* remove old flags to prevent ambiguities */
                prev_ntype_check = 0;
                prev_func_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* if not '*', there is no prefix so it can still be NodeType/FunctionName, we can't finally decide now */
                prev_ntype_check = (expr_str[parsed] == '*') ? 0 : 1;
                prev_func_check = (prev_ntype_check && !has_axis) ? 1 : 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        LY_CHECK_GOTO(ret = exp_add_token(ctx, expr, tok_type, parsed, tok_len), error);
        parsed += tok_len;
        while (is_xmlws(expr_str[parsed])) {
            ++parsed;
        }

    } while (expr_str[parsed]);

    if (reparse) {
        /* prealloc repeat */
        expr->repeat = calloc(expr->size, sizeof *expr->repeat);
        LY_CHECK_ERR_GOTO(!expr->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

        /* fill repeat */
        LY_CHECK_ERR_GOTO(reparse_or_expr(ctx, expr, &tok_idx, 0), ret = LY_EVALID, error);
        if (expr->used > tok_idx) {
            LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of an XPath expression.",
                    &expr->expr[expr->tok_pos[tok_idx]]);
            ret = LY_EVALID;
            goto error;
        }
    }

    print_expr_struct_debug(expr);
    *expr_p = expr;
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, expr);
    return ret;
}